

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  ogg_int32_t *poVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  
  if (book->used_entries < 1) {
    if (0 < n) {
      do {
      } while (book->dim < 1);
      do {
        *a = 0;
        a = a + 1;
      } while( true );
    }
  }
  else {
    iVar6 = point - book->binarypoint;
    bVar4 = (byte)iVar6;
    if (iVar6 < 0) {
      if (n < 1) {
        return 0;
      }
      iVar6 = 0;
      do {
        lVar3 = decode_packed_entry_number(book,b);
        if ((int)lVar3 == -1) {
          return -1;
        }
        lVar1 = book->dim;
        if (0 < lVar1) {
          poVar2 = book->valuelist;
          lVar5 = 0;
          do {
            a[iVar6 + lVar5] = poVar2[(int)lVar3 * lVar1 + lVar5] << (-bVar4 & 0x1f);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
          iVar6 = iVar6 + (int)lVar5;
        }
      } while (iVar6 < n);
    }
    else {
      if (n < 1) {
        return 0;
      }
      iVar6 = 0;
      do {
        lVar3 = decode_packed_entry_number(book,b);
        if ((int)lVar3 == -1) {
          return -1;
        }
        lVar1 = book->dim;
        if (0 < lVar1) {
          poVar2 = book->valuelist;
          lVar5 = 0;
          do {
            a[iVar6 + lVar5] = poVar2[(int)lVar3 * lVar1 + lVar5] >> (bVar4 & 0x1f);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
          iVar6 = iVar6 + (int)lVar5;
        }
      } while (iVar6 < n);
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,
			     oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){
    int i,j,entry;
    ogg_int32_t *t;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]>>shift;
	}
      }
    }else{
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]<<-shift;
	}
      }
    }
  }else{

    int i,j;
    for(i=0;i<n;){
      for (j=0;j<book->dim;){
	a[i++]=0;
      }
    }
  }
  return(0);
}